

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O0

int ndiGetPSTATPartNumber(ndicapi *pol,int port,char *part)

{
  char (*local_30) [20];
  char *dp;
  char *part_local;
  int port_local;
  ndicapi *pol_local;
  
  if ((port < 0x31) || (0x33 < port)) {
    if ((port < 0x41) || (0x49 < port)) {
      return 3;
    }
    local_30 = pol->PstatPassivePartNumber + (port + -0x41);
  }
  else {
    local_30 = pol->PstatPartNumber + (port + -0x31);
  }
  if ((*local_30)[0] == '\0') {
    pol_local._4_4_ = 3;
  }
  else {
    strncpy(part,*local_30,0x14);
    pol_local._4_4_ = 0;
  }
  return pol_local._4_4_;
}

Assistant:

ndicapiExport int ndiGetPSTATPartNumber(ndicapi* pol, int port, char part[20])
{
  char* dp;

  if (port >= '1' && port <= '3')
  {
    dp = pol->PstatPartNumber[port - '1'];
  }
  else if (port >= 'A' && port <= 'I')
  {
    dp = pol->PstatPassivePartNumber[port - 'A'];
  }
  else
  {
    return NDI_UNOCCUPIED;
  }

  if (*dp == '\0')
  {
    return NDI_UNOCCUPIED;
  }

  strncpy(part, dp, 20);

  return NDI_OKAY;
}